

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O1

istream * FIX::operator>>(istream *stream,SessionSettings *s)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  Sections section;
  string sessionQualifier;
  TargetCompID targetCompID;
  SenderCompID senderCompID;
  Dictionary dict;
  SessionID sessionID;
  BeginString beginString;
  Settings settings;
  Dictionary def;
  vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> local_448;
  string local_428;
  SessionSettings *local_408;
  pointer local_400;
  string local_3f8;
  undefined1 local_3d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  undefined1 local_3b8 [16];
  _Alloc_hider local_3a8;
  size_type local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  field_metrics local_388;
  undefined1 local_380 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  undefined1 local_360 [16];
  _Alloc_hider local_350;
  size_type local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  field_metrics local_330;
  istream *local_328;
  undefined **local_320;
  undefined **local_318;
  pointer local_310;
  undefined1 local_308 [8];
  pointer pDStack_300;
  pointer local_2f8;
  _Base_ptr local_2f0;
  _Base_ptr local_2e8;
  _Base_ptr local_2e0;
  size_t local_2d8;
  _Alloc_hider local_2d0;
  size_type local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  undefined1 local_2b0 [88];
  FieldBase local_258;
  FieldBase local_200;
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  undefined1 local_160 [8];
  pointer pDStack_158;
  undefined1 local_150 [32];
  _Alloc_hider local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  field_metrics local_110;
  Settings local_108;
  undefined1 local_e8 [8];
  undefined1 auStack_e0 [8];
  _Rb_tree_node_base local_d8;
  size_t local_b8;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined1 local_88 [56];
  _Alloc_hider local_50;
  char local_40 [16];
  
  local_108.m_resolveEnvVars = s->m_resolveEnvVars;
  local_108.m_sections.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.m_sections.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.m_sections.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_408 = s;
  operator>>(stream,&local_108);
  local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"DEFAULT","");
  Settings::get((Sections *)local_308,&local_108,(string *)local_2b0);
  local_d8._0_8_ =
       local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  auStack_e0 = (undefined1  [8])
               local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  local_e8 = (undefined1  [8])
             local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl
             .super__Vector_impl_data._M_start;
  local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_308;
  local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_finish = pDStack_300;
  local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_2f8;
  local_308 = (undefined1  [8])0x0;
  pDStack_300 = (pointer)0x0;
  local_2f8 = (pointer)0x0;
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector
            ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)local_e8);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector
            ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)local_308);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
  }
  local_d8._M_left = &local_d8;
  local_400 = (pointer)&PTR__Dictionary_001f8500;
  local_e8 = (undefined1  [8])&PTR__Dictionary_001f8500;
  local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
  local_d8._M_parent = (_Base_ptr)0x0;
  local_b8 = 0;
  local_b0._M_p = (pointer)&local_a0;
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_d8._M_right = local_d8._M_left;
  if (local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)auStack_e0,
                &((local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>.
                   _M_impl.super__Vector_impl_data._M_start)->m_data)._M_t);
    std::__cxx11::string::_M_assign((string *)&local_b0);
  }
  SessionSettings::set(local_408,(Dictionary *)local_e8);
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"SESSION","");
  Settings::get((Sections *)local_160,&local_108,(string *)local_2b0);
  local_2f8 = local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  pDStack_300 = local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  local_308 = (undefined1  [8])
              local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_160;
  local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_finish = pDStack_158;
  local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_150._0_8_;
  local_160 = (undefined1  [8])0x0;
  pDStack_158 = (pointer)0x0;
  local_150._0_8_ = (pointer)0x0;
  local_328 = stream;
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector
            ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)local_308);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector
            ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)local_160);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
  }
  local_2e8 = (_Base_ptr)&local_2f8;
  local_308 = (undefined1  [8])local_400;
  local_2f8 = (pointer)((ulong)local_2f8 & 0xffffffff00000000);
  local_2f0 = (_Base_ptr)0x0;
  local_2d8 = 0;
  local_2d0._M_p = (pointer)&local_2c0;
  local_2c8 = 0;
  local_2c0._M_local_buf[0] = '\0';
  local_2e0 = local_2e8;
  if (local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_448.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_310 = (pointer)&PTR__FieldBase_001f8410;
    local_318 = &PTR__FieldBase_001f8490;
    local_320 = &PTR__FieldBase_001f84c8;
    lVar3 = 0x38;
    uVar2 = 0;
    do {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&pDStack_300,
                  (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)local_448.
                            super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar3 + -0x30));
      std::__cxx11::string::_M_assign((string *)&local_2d0);
      Dictionary::merge((Dictionary *)local_308,(Dictionary *)local_e8);
      local_380._0_8_ = local_380 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"BeginString","");
      Dictionary::getString((string *)local_2b0,(Dictionary *)local_308,(string *)local_380,false);
      local_160 = (undefined1  [8])&PTR__FieldBase_001f8470;
      pDStack_158 = (pointer)CONCAT44(pDStack_158._4_4_,8);
      local_150._0_8_ = local_150 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_150,local_2b0._0_8_,(pointer)(local_2b0._0_8_ + local_2b0._8_8_));
      local_130._M_p = (pointer)&local_120;
      local_128 = 0;
      local_120._M_local_buf[0] = '\0';
      local_110.m_length = 0;
      local_110.m_checksum = 0;
      local_160 = (undefined1  [8])local_310;
      if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
      if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
        operator_delete((void *)local_380._0_8_,(ulong)(local_370._M_allocated_capacity + 1));
      }
      local_3d8._0_8_ = local_3d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"SenderCompID","");
      Dictionary::getString((string *)local_2b0,(Dictionary *)local_308,(string *)local_3d8,false);
      local_380._0_8_ = &PTR__FieldBase_001f8470;
      local_380._8_4_ = 0x31;
      local_370._M_allocated_capacity = (size_type)local_360;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_380 + 0x10),local_2b0._0_8_,
                 (pointer)(local_2b0._0_8_ + local_2b0._8_8_));
      local_350._M_p = (pointer)&local_340;
      local_348 = 0;
      local_340._M_local_buf[0] = '\0';
      local_330.m_length = 0;
      local_330.m_checksum = 0;
      local_380._0_8_ = local_318;
      if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
      if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
        operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._M_allocated_capacity + 1));
      }
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"TargetCompID","");
      Dictionary::getString((string *)local_2b0,(Dictionary *)local_308,&local_428,false);
      local_3d8._0_8_ = &PTR__FieldBase_001f8470;
      local_3d8._8_4_ = 0x38;
      local_3c8._M_allocated_capacity = (size_type)local_3b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_3d8 + 0x10),local_2b0._0_8_,
                 (pointer)(local_2b0._0_8_ + local_2b0._8_8_));
      local_3a8._M_p = (pointer)&local_398;
      local_3a0 = 0;
      local_398._M_local_buf[0] = '\0';
      local_388.m_length = 0;
      local_388.m_checksum = 0;
      local_3d8._0_8_ = local_320;
      if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,
                        CONCAT71(local_428.field_2._M_allocated_capacity._1_7_,
                                 local_428.field_2._M_local_buf[0]) + 1);
      }
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      local_428._M_string_length = 0;
      local_428.field_2._M_local_buf[0] = '\0';
      local_2b0._0_8_ = local_2b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"SessionQualifier","");
      bVar1 = Dictionary::has((Dictionary *)local_308,(string *)local_2b0);
      if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
      if (bVar1) {
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"SessionQualifier","");
        Dictionary::getString((string *)local_2b0,(Dictionary *)local_308,&local_3f8,false);
        std::__cxx11::string::operator=((string *)&local_428,(string *)local_2b0);
        if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
          operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
      }
      SessionID::SessionID
                ((SessionID *)local_2b0,(string *)local_150,(string *)(local_380 + 0x10),
                 (string *)(local_3d8 + 0x10),&local_428);
      local_88._0_8_ = local_400;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_88 + 8),
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&pDStack_300);
      local_50._M_p = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_2d0._M_p,local_2d0._M_p + local_2c8);
      SessionSettings::set(local_408,(SessionID *)local_2b0,(Dictionary *)local_88);
      Dictionary::~Dictionary((Dictionary *)local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_p != &local_170) {
        operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_p != &local_198) {
        operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
      }
      FieldBase::~FieldBase(&local_200);
      FieldBase::~FieldBase(&local_258);
      FieldBase::~FieldBase((FieldBase *)local_2b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,
                        CONCAT71(local_428.field_2._M_allocated_capacity._1_7_,
                                 local_428.field_2._M_local_buf[0]) + 1);
      }
      FieldBase::~FieldBase((FieldBase *)local_3d8);
      FieldBase::~FieldBase((FieldBase *)local_380);
      FieldBase::~FieldBase((FieldBase *)local_160);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x58;
    } while (uVar2 < (ulong)(((long)local_448.
                                    super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_448.
                                    super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x2e8ba2e8ba2e8ba3));
  }
  Dictionary::~Dictionary((Dictionary *)local_308);
  Dictionary::~Dictionary((Dictionary *)local_e8);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector(&local_448);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector(&local_108.m_sections);
  return local_328;
}

Assistant:

EXCEPT(ConfigError) {
  Settings settings(s.m_resolveEnvVars);
  stream >> settings;

  Settings::Sections section;

  section = settings.get("DEFAULT");
  Dictionary def;
  if (section.size()) {
    def = section[0];
  }
  s.set(def);

  section = settings.get("SESSION");
  Settings::Sections::size_type session;
  Dictionary dict;

  for (session = 0; session < section.size(); ++session) {
    dict = section[session];
    dict.merge(def);

    BeginString beginString(dict.getString(BEGINSTRING));
    SenderCompID senderCompID(dict.getString(SENDERCOMPID));
    TargetCompID targetCompID(dict.getString(TARGETCOMPID));

    std::string sessionQualifier;
    if (dict.has(SESSION_QUALIFIER)) {
      sessionQualifier = dict.getString(SESSION_QUALIFIER);
    }
    SessionID sessionID(beginString, senderCompID, targetCompID, sessionQualifier);
    s.set(sessionID, dict);
  }
  return stream;
}